

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ProgressBar::paintEvent(ProgressBar *this,QPaintEvent *param_1)

{
  Orientation OVar1;
  ProgressBarPrivate *pPVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  QPainter p;
  QBrush local_80 [8];
  QRect r;
  QRect a1;
  QRect a2;
  
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  r = ProgressBarPrivate::grooveRect((this->d).d);
  pPVar2 = (this->d).d;
  if (pPVar2->animate == false) {
    pPVar2->lastPaintedValue = pPVar2->value;
    dVar11 = (double)pPVar2->value / (double)(pPVar2->maximum - pPVar2->minimum);
    OVar1 = pPVar2->orientation;
    iVar4 = r.y2;
    iVar3 = r.x2;
    if (OVar1 == Horizontal) {
      iVar8 = (int)(dVar11 * (double)((iVar3 - r.x1) + 1));
      a1.x1 = iVar3 - iVar8;
      bVar10 = false;
      if (pPVar2->invertedAppearance == false) {
        a1.x1 = 0;
      }
      iVar5 = pPVar2->grooveHeight;
      a1.y1 = 0;
    }
    else {
      iVar5 = (int)(dVar11 * (double)((iVar4 - r.y1) + 1));
      a1.x1 = 0;
      bVar10 = OVar1 == Vertical;
      a1.y1 = 0;
      if (bVar10) {
        a1.y1 = 0;
        if (pPVar2->invertedAppearance != false) {
          a1.y1 = iVar4 - iVar5;
        }
      }
      iVar8 = pPVar2->grooveHeight;
    }
    a1.x2 = iVar8 + a1.x1 + -1;
    a1.y2 = a1.y1 + iVar5 + -1;
    iVar9 = 0;
    if ((OVar1 == Horizontal) && (iVar9 = 0, pPVar2->invertedAppearance == false)) {
      iVar9 = iVar8;
    }
    iVar6 = 0;
    if ((bVar10) && (iVar6 = 0, pPVar2->invertedAppearance == false)) {
      iVar6 = iVar5;
    }
    iVar7 = 0;
    if (OVar1 == Horizontal) {
      iVar7 = 0;
      if (pPVar2->invertedAppearance != false) {
        iVar7 = -iVar8;
      }
    }
    iVar8 = 0;
    if (bVar10) {
      iVar8 = 0;
      if (pPVar2->invertedAppearance != false) {
        iVar8 = -iVar5;
      }
    }
    a2.x1 = iVar9 + r.x1;
    a2.x2 = iVar7 + iVar3;
    a2.y1 = iVar6 + r.y1;
    a2.y2 = iVar8 + iVar4;
    QPainter::setPen((QColor *)&p);
    QBrush::QBrush(local_80,&((this->d).d)->grooveColor,SolidPattern);
    QPainter::setBrush((QBrush *)&p);
    QBrush::~QBrush(local_80);
    QPainter::drawRect(&p,&a2);
    QPainter::setPen((QColor *)&p);
    QBrush::QBrush(local_80,&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)&p);
    QBrush::~QBrush(local_80);
    QPainter::drawRect(&p,&a1);
  }
  else {
    QVariantAnimation::currentValue();
    dVar11 = (double)QVariant::toDouble((bool *)&a1);
    QVariant::~QVariant((QVariant *)&a1);
    QPainter::setPen((QColor *)&p);
    QBrush::QBrush((QBrush *)&a1,&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)&p);
    QBrush::~QBrush((QBrush *)&a1);
    QPainter::drawRect(&p,&r);
    pPVar2 = (this->d).d;
    if (pPVar2->orientation == Horizontal) {
      iVar4 = pPVar2->grooveHeight;
      dVar12 = (double)r.y1;
      a1.x1 = (int)((double)iVar4 + ((double)((r.x2 - r.x1) + 1) * dVar11) / 3.0 + (double)r.x1);
    }
    else {
      iVar4 = pPVar2->grooveHeight;
      dVar12 = (double)iVar4 + ((double)((r.y2 - r.y1) + 1) * dVar11) / 3.0 + (double)r.y1;
      a1.x1 = r.x1;
    }
    a1.y1 = (int)dVar12;
    a1.x2 = a1.x1 + iVar4 + -1;
    a1.y2 = iVar4 + a1.y1 + -1;
    if (pPVar2->orientation == Horizontal) {
      iVar3 = (r.x2 - r.x1) + 1;
      dVar12 = (double)r.y1;
      a2.x1 = (int)((double)(iVar3 / 3) + (dVar11 * (double)iVar3) / 1.5 + (double)r.x1);
    }
    else {
      iVar3 = (r.y2 - r.y1) + 1;
      dVar12 = (double)(iVar3 / 3) + (dVar11 * (double)iVar3) / 1.5 + (double)r.y1;
      a2.x1 = r.x1;
    }
    a2.y1 = (int)dVar12;
    a2.y2 = iVar4 + -1 + (int)dVar12;
    a2.x2 = a2.x1 + iVar4 + -1;
    QPainter::setPen((QColor *)&p);
    QBrush::QBrush(local_80,&((this->d).d)->animationColor,SolidPattern);
    QPainter::setBrush((QBrush *)&p);
    QBrush::~QBrush(local_80);
    QPainter::drawRect(&p,&a1);
    QPainter::drawRect(&p,&a2);
  }
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
ProgressBar::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	const QRect r = d->grooveRect();

	if( !d->animate )
	{
		d->lastPaintedValue = d->value;

		const int offset = (qreal) d->value / (qreal) ( d->maximum - d->minimum ) *
			( d->orientation == Qt::Horizontal ? r.width() : r.height() );

		const int x = ( ( d->orientation == Qt::Horizontal && d->invertedAppearance ) ?
			r.x() + r.width() - offset - 1 : 0 );
		const int y = ( ( d->orientation == Qt::Vertical && d->invertedAppearance ) ?
			r.y() + r.height() - offset - 1 : 0 );
		const int width = ( d->orientation == Qt::Horizontal ?
			offset : d->grooveHeight );
		const int height = ( d->orientation == Qt::Horizontal ?
			d->grooveHeight : offset );

		const QRect highlightedRect( x, y, width, height );
		const QRect baseRect = r.adjusted(
			( d->orientation == Qt::Horizontal && !d->invertedAppearance ?
				  width : 0 ),
			( d->orientation == Qt::Vertical && !d->invertedAppearance ?
				  height : 0 ),
			( d->orientation == Qt::Horizontal && d->invertedAppearance ?
				  -width : 0 ),
			( d->orientation == Qt::Vertical && d->invertedAppearance ?
				  -height : 0 ) );

		p.setPen( d->grooveColor );
		p.setBrush( d->grooveColor );

		p.drawRect( baseRect );

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( highlightedRect );
	}
	else
	{
		const double value = d->animation->currentValue().toDouble();

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( r );

		const QRect a1(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 3.0 + d->grooveHeight :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 3.0 + d->grooveHeight ),
			d->grooveHeight, d->grooveHeight );

		const QRect a2(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 1.5 + r.width() / 3 :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 1.5 + r.height() / 3 ),
			d->grooveHeight, d->grooveHeight );

		p.setPen( d->animationColor );
		p.setBrush( d->animationColor );

		p.drawRect( a1 );
		p.drawRect( a2 );
	}
}